

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::device_tree::parse_dtb(device_tree *this,string *fn,FILE *param_2)

{
  bool *this_00;
  pointer *pppVar1;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  device_tree *pdVar2;
  undefined1 this_02 [8];
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t token;
  uint64_t length;
  uint64_t start;
  unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> in;
  input_buffer struct_table;
  header h;
  input_buffer strings_table;
  input_buffer reservation_map;
  uint local_d4;
  device_tree *local_d0;
  char *local_c8;
  _func_int **local_c0;
  undefined1 local_b8 [8];
  input_buffer local_b0;
  undefined1 local_98 [24];
  int local_80;
  int local_7c;
  float local_78;
  undefined8 local_74;
  uint32_t local_6c;
  int local_68;
  int local_64;
  input_buffer local_60;
  input_buffer local_48;
  
  input_buffer::buffer_for_file((input_buffer *)local_b8,fn,true);
  this_02 = local_b8;
  if (local_b8 == (undefined1  [8])0x0) {
    this->valid = false;
    goto LAB_001282db;
  }
  local_98._16_4_ = 0xd00dfeed;
  local_74 = 0x1000000011;
  local_6c = 0;
  bVar5 = dtb::header::read_dtb((header *)(local_98 + 0x10),(input_buffer *)local_b8);
  this_00 = &this->valid;
  this->valid = bVar5;
  this->boot_cpu = local_6c;
  if (0x11 < local_74._4_4_) {
    parse_dtb((device_tree *)this_00);
  }
  if (*this_00 != true) goto LAB_001282db;
  local_d0 = (device_tree *)this_00;
  input_buffer::buffer_from_offset(&local_48,(input_buffer *)this_02,(int)local_78,0);
  do {
    bVar5 = input_buffer::consume_binary<unsigned_long>(&local_48,(unsigned_long *)&local_c0);
    if (!bVar5) {
LAB_0012830a:
      parse_dtb(local_d0);
      goto LAB_001282db;
    }
    bVar5 = input_buffer::consume_binary<unsigned_long>(&local_48,(unsigned_long *)&local_c8);
    if (!bVar5) goto LAB_0012830a;
    if (local_c0 != (_func_int **)0x0 || local_c8 != (char *)0x0) {
      local_b0._vptr_input_buffer = local_c0;
      local_b0.buffer = local_c8;
      __position._M_current =
           (this->reservations).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->reservations).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&this->reservations,__position,
                   (pair<unsigned_long,_unsigned_long> *)(local_b8 + 8));
      }
      else {
        (__position._M_current)->first = (unsigned_long)local_c0;
        (__position._M_current)->second = (unsigned_long)local_c8;
        pppVar1 = &(this->reservations).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
    }
  } while (local_c8 != (char *)0x0 || local_c0 != (_func_int **)0x0);
  input_buffer::buffer_from_offset
            ((input_buffer *)(local_b8 + 8),(input_buffer *)this_02,local_80,local_64);
  input_buffer::buffer_from_offset(&local_60,(input_buffer *)this_02,local_7c,local_68);
  pdVar2 = local_d0;
  bVar5 = input_buffer::consume_binary<unsigned_int>((input_buffer *)(local_b8 + 8),&local_d4);
  if ((bVar5) && (local_d4 == 1)) {
    node::parse_dtb((node *)local_98,(input_buffer *)(local_b8 + 8),&local_60);
    uVar4 = local_98._8_8_;
    uVar3 = local_98._0_8_;
    local_98._0_8_ = (element_type *)0x0;
    local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    bVar5 = input_buffer::consume_binary<unsigned_int>((input_buffer *)(local_b8 + 8),&local_d4);
    if ((!bVar5) || (local_d4 != 9)) {
      parse_dtb();
      goto LAB_00128322;
    }
    bVar5 = (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0;
  }
  else {
    parse_dtb();
LAB_00128322:
    bVar5 = false;
  }
  *(bool *)&pdVar2->phandle_node_name = bVar5;
LAB_001282db:
  if (local_b8 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_b8)[2])();
  }
  return;
}

Assistant:

void
device_tree::parse_dtb(const string &fn, FILE *)
{
	auto in = input_buffer::buffer_for_file(fn);
	if (in == 0)
	{
		valid = false;
		return;
	}
	input_buffer &input = *in;
	dtb::header h;
	valid = h.read_dtb(input);
	boot_cpu = h.boot_cpuid_phys;
	if (h.last_comp_version > 17)
	{
		fprintf(stderr, "Don't know how to read this version of the device tree blob");
		valid = false;
	}
	if (!valid)
	{
		return;
	}
	input_buffer reservation_map =
		input.buffer_from_offset(h.off_mem_rsvmap, 0);
	uint64_t start, length;
	do
	{
		if (!(reservation_map.consume_binary(start) &&
		      reservation_map.consume_binary(length)))
		{
			fprintf(stderr, "Failed to read memory reservation table\n");
			valid = false;
			return;
		}
		if (start != 0 || length != 0)
		{
			reservations.push_back(reservation(start, length));
		}
	} while (!((start == 0) && (length == 0)));
	input_buffer struct_table =
		input.buffer_from_offset(h.off_dt_struct, h.size_dt_struct);
	input_buffer strings_table =
		input.buffer_from_offset(h.off_dt_strings, h.size_dt_strings);
	uint32_t token;
	if (!(struct_table.consume_binary(token) &&
		(token == dtb::FDT_BEGIN_NODE)))
	{
		fprintf(stderr, "Expected FDT_BEGIN_NODE token.\n");
		valid = false;
		return;
	}
	root = node::parse_dtb(struct_table, strings_table);
	if (!(struct_table.consume_binary(token) && (token == dtb::FDT_END)))
	{
		fprintf(stderr, "Expected FDT_END token after parsing root node.\n");
		valid = false;
		return;
	}
	valid = (root != 0);
}